

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect.hpp
# Opt level: O1

iterator_range<burst::semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>_>
* __thiscall
burst::semiintersect_t::operator()
          (iterator_range<burst::semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>_>
           *__return_storage_ptr__,semiintersect_t *this,
          tuple<const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>
          *args,int *args_1)

{
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
  end;
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
  begin;
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
  local_130;
  element_type *local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e8;
  iterator_range<const_int_*> *local_e0;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  iterator_range<const_int_*> *local_c8;
  size_t sStack_c0;
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
  local_b0;
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
  local_70;
  initializer_list<int> *local_30;
  initializer_list<int> *local_28;
  initializer_list<int> *local_20;
  
  local_30 = (args->
             super__Tuple_impl<0UL,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>
             ).
             super__Tuple_impl<1UL,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>
             .super__Tuple_impl<2UL,_const_std::initializer_list<int>_&>.
             super__Head_base<2UL,_const_std::initializer_list<int>_&,_false>._M_head_impl;
  local_28 = (args->
             super__Tuple_impl<0UL,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>
             ).
             super__Tuple_impl<1UL,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>
             .super__Head_base<1UL,_const_std::initializer_list<int>_&,_false>._M_head_impl;
  local_20 = (args->
             super__Tuple_impl<0UL,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>
             ).super__Head_base<0UL,_const_std::initializer_list<int>_&,_false>._M_head_impl;
  make_semiintersect_iterator<std::initializer_list<int>const,std::initializer_list<int>const,std::initializer_list<int>const,int>
            (&local_70,(burst *)&local_30,
             (tuple<const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>
              *)(ulong)(uint)*args_1,(int)args_1);
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
  ::semiintersect_iterator(&local_b0,&local_70);
  local_f0 = local_70.m_begin.m_container.
             super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  p_Stack_e8 = local_70.m_begin.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
  local_70.m_begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_70.m_begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e0 = local_70.m_begin.m_iterator._M_current;
  local_d8 = local_70.m_end.m_container.
             super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  p_Stack_d0 = local_70.m_end.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
  local_70.m_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_70.m_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c8 = local_70.m_end.m_iterator._M_current;
  sStack_c0 = local_70.m_min_items;
  local_130.m_begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_b0.m_begin.m_container.
            super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_130.m_begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_b0.m_begin.m_container.
       super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_b0.m_begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_b0.m_begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_130.m_begin.m_iterator._M_current = local_b0.m_begin.m_iterator._M_current;
  local_130.m_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_b0.m_end.m_container.
            super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_130.m_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_b0.m_end.m_container.
       super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_b0.m_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_b0.m_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_130.m_end.m_iterator._M_current = local_b0.m_end.m_iterator._M_current;
  local_130.m_min_items = local_b0.m_min_items;
  boost::
  make_iterator_range<burst::semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,std::less<void>>>
            (__return_storage_ptr__,(boost *)&local_f0,&local_130,
             (semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
              *)args_1);
  if (local_130.m_end.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_130.m_end.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_130.m_begin.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_130.m_begin.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
  }
  if (p_Stack_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e8);
  }
  if (local_b0.m_end.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.m_end.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b0.m_begin.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.m_begin.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_70.m_end.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.m_end.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_70.m_begin.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.m_begin.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Args && ... args) const
        {
            auto begin = make_semiintersect_iterator(std::forward<Args>(args)...);
            auto end = make_semiintersect_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }